

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall gl4cts::EnhancedLayouts::Utils::Variable::Variable(Variable *this,Variable *var)

{
  GLchar *name;
  GLchar *qualifiers;
  Variable *var_local;
  Variable *this_local;
  
  this->m_data = var->m_data;
  this->m_data_size = var->m_data_size;
  name = (GLchar *)std::__cxx11::string::c_str();
  qualifiers = (GLchar *)std::__cxx11::string::c_str();
  Descriptor::Descriptor
            (&this->m_descriptor,name,qualifiers,(var->m_descriptor).m_expected_component,
             (var->m_descriptor).m_expected_location,&(var->m_descriptor).field_9.m_builtin,
             (var->m_descriptor).m_normalized,(var->m_descriptor).m_n_array_elements,
             (var->m_descriptor).m_expected_stride_of_element,(var->m_descriptor).m_offset);
  this->m_storage = var->m_storage;
  (this->m_descriptor).m_type = (var->m_descriptor).m_type;
  if ((var->m_descriptor).m_type != BUILTIN) {
    (this->m_descriptor).field_9.m_interface = (var->m_descriptor).field_9.m_interface;
  }
  return;
}

Assistant:

Variable::Variable(const Variable& var)
	: m_data(var.m_data)
	, m_data_size(var.m_data_size)
	, m_descriptor(var.m_descriptor.m_name.c_str(), var.m_descriptor.m_qualifiers.c_str(),
				   var.m_descriptor.m_expected_component, var.m_descriptor.m_expected_location,
				   var.m_descriptor.m_builtin, var.m_descriptor.m_normalized, var.m_descriptor.m_n_array_elements,
				   var.m_descriptor.m_expected_stride_of_element, var.m_descriptor.m_offset)
	, m_storage(var.m_storage)
{
	m_descriptor.m_type = var.m_descriptor.m_type;

	if (BUILTIN != var.m_descriptor.m_type)
	{
		m_descriptor.m_interface = var.m_descriptor.m_interface;
	}
}